

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeTensorLayoutNV(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  DiagnosticStream *pDVar5;
  string local_440;
  char *local_420;
  DiagnosticStream local_418;
  ulong local_240;
  uint64_t clamp_value;
  char *local_218;
  DiagnosticStream local_210;
  Instruction *local_38;
  Instruction *clamp;
  undefined4 local_28;
  uint clamp_id;
  int clamp_index;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _clamp_index = inst;
  inst_local = (Instruction *)_;
  clamp_id = ValidateTensorDim(_,inst);
  __local._4_4_ = clamp_id;
  if (clamp_id == SPV_SUCCESS) {
    local_28 = 2;
    clamp._4_4_ = Instruction::GetOperandAs<unsigned_int>(_clamp_index,2);
    local_38 = ValidationState_t::FindDef((ValidationState_t *)inst_local,clamp._4_4_);
    pIVar1 = inst_local;
    if (local_38 != (Instruction *)0x0) {
      uVar3 = Instruction::type_id(local_38);
      bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar1,uVar3);
      pIVar1 = inst_local;
      if (bVar2) {
        uVar3 = Instruction::type_id(local_38);
        uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)pIVar1,uVar3);
        if (uVar3 == 0x20) {
          bVar2 = ValidationState_t::EvalConstantValUint64
                            ((ValidationState_t *)inst_local,clamp._4_4_,&local_240);
          if ((bVar2) && (4 < local_240)) {
            ValidationState_t::diag
                      (&local_418,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_clamp_index)
            ;
            OVar4 = Instruction::opcode(_clamp_index);
            local_420 = spvOpcodeString(OVar4);
            pDVar5 = DiagnosticStream::operator<<(&local_418,&local_420);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [17])" ClampMode <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      (&local_440,(ValidationState_t *)inst_local,clamp._4_4_);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_440);
            pDVar5 = DiagnosticStream::operator<<
                               (pDVar5,(char (*) [34])" must be a valid TensorClampMode.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            std::__cxx11::string::~string((string *)&local_440);
            DiagnosticStream::~DiagnosticStream(&local_418);
            return __local._4_4_;
          }
          return SPV_SUCCESS;
        }
      }
    }
    ValidationState_t::diag
              (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_clamp_index);
    OVar4 = Instruction::opcode(_clamp_index);
    local_218 = spvOpcodeString(OVar4);
    pDVar5 = DiagnosticStream::operator<<(&local_210,&local_218);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [17])" ClampMode <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)&clamp_value,(ValidationState_t *)inst_local,clamp._4_4_);
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &clamp_value);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [26])" is not a 32-bit integer.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    std::__cxx11::string::~string((string *)&clamp_value);
    DiagnosticStream::~DiagnosticStream(&local_210);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeTensorLayoutNV(ValidationState_t& _,
                                        const Instruction* inst) {
  if (auto error = ValidateTensorDim(_, inst)) return error;

  const auto clamp_index = 2;
  const auto clamp_id = inst->GetOperandAs<uint32_t>(clamp_index);
  const auto clamp = _.FindDef(clamp_id);
  if (!clamp || !_.IsIntScalarType(clamp->type_id()) ||
      _.GetBitWidth(clamp->type_id()) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " ClampMode <id> "
           << _.getIdName(clamp_id) << " is not a 32-bit integer.";
  }

  uint64_t clamp_value;
  if (_.EvalConstantValUint64(clamp_id, &clamp_value)) {
    if (clamp_value >
        static_cast<uint32_t>(spv::TensorClampMode::RepeatMirrored)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " ClampMode <id> "
             << _.getIdName(clamp_id) << " must be a valid TensorClampMode.";
    }
  }

  return SPV_SUCCESS;
}